

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O3

basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__a_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_void>_>,_std::tuple<>,_std::tuple<>_>
* __thiscall
nonsugar::
basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>>,std::tuple<>,std::tuple<>>
::flag<(char)99,void>
          (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__a_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_void>_>,_std::tuple<>,_std::tuple<>_>
           *__return_storage_ptr__,void *this,initializer_list<char> short_names,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          long_names,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *placeholder,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *help,flag_type type)

{
  pointer pcVar1;
  allocator_type local_2c9;
  undefined1 local_2c8 [48];
  _Alloc_hider local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  element_type *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_250;
  _Any_data local_248;
  _Manager_type local_238;
  code *local_230;
  bool local_228;
  _Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__a_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_void>_>
  local_220;
  
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_2c8,short_names,
             (allocator_type *)&local_220);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_2c8 + 0x18),long_names,&local_2c9);
  pcVar1 = (placeholder->_M_dataplus)._M_p;
  local_298._M_p = (pointer)&local_288;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,pcVar1,pcVar1 + placeholder->_M_string_length);
  pcVar1 = (help->_M_dataplus)._M_p;
  local_278._M_p = (pointer)&local_268;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,pcVar1,pcVar1 + help->_M_string_length);
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  local_258 = (element_type *)0x0;
  _Stack_250._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_230 = std::
              _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>_>
              ::_M_invoke;
  local_238 = std::
              _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>_>
              ::_M_manager;
  local_228 = type == exclusive;
  std::
  _Tuple_impl<0ul,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>
  ::
  _Tuple_impl<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>const&,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>const&,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>,void>
            ((_Tuple_impl<0ul,nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>
              *)&local_220,
             (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__a_,_void>
              *)((long)this + 0xe8),
             (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_int>
              *)((long)this + 0x40),
             (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_void>
              *)local_2c8);
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'a',_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'b',_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'c',_void>_>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(__return_storage_ptr__,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)this + 0x20),
                  (tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__a_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_void>_>
                   *)&local_220,(tuple<> *)((long)this + 400),(tuple<> *)((long)this + 0x191));
  std::
  _Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'a',_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'b',_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'c',_void>_>
  ::~_Tuple_impl(&local_220);
  if (local_238 != (_Manager_type)0x0) {
    (*local_238)(&local_248,&local_248,__destroy_functor);
  }
  if (_Stack_250._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_250._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_p != &local_268) {
    operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_p != &local_288) {
    operator_delete(local_298._M_p,local_288._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2c8 + 0x18));
  if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ - local_2c8._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

auto flag(
        std::initializer_list<char_type> short_names, std::initializer_list<String> long_names,
        String const &placeholder, String const &help, flag_type type = flag_type::normal) const
    {
        detail::flag<String, OptionType, Option, Value> f {
            short_names, long_names, placeholder, help, {},
            value_read<String, typename detail::value_of<String, Value>::type>(),
            type == flag_type::exclusive };
        return detail::make_command<String, OptionType>(
            m_header, m_footer, detail::tuple_append(m_flags, std::move(f)), m_subcommands,
            m_arguments);
    }